

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

bool relaxedMaComma(char **p)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = *p;
  cVar1 = *pcVar2;
  while ((byte)(cVar1 - 1U) < 0x20) {
    pcVar2 = pcVar2 + 1;
    *p = pcVar2;
    cVar1 = *pcVar2;
  }
  pcVar2 = *p;
  if (*pcVar2 != ',') {
    return false;
  }
  if (pcVar2[1] == ',') {
    if (DAT_0018d520 == comma) {
      return false;
    }
    pcVar2 = pcVar2 + 2;
  }
  else {
    pcVar2 = pcVar2 + 1;
  }
  *p = pcVar2;
  return true;
}

Assistant:

bool relaxedMaComma(char* & p) {
	SkipBlanks(p);
	if (',' != p[0]) return false;		// no comma
	if (',' == p[1]) {
		// double comma detected, accept it only in --syntax=a mode
		if (Options::syx.isMultiArgPlainComma()) return false;
		p += 2;
		return true;
	}
	// single comma is enough in relaxed way, even in --syntax=a mode
	++p;
	return true;
}